

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O0

void ctemplate_htmlparser::statemachine_definition_delete(statemachine_definition *def)

{
  statemachine_definition *def_local;
  
  if (def != (statemachine_definition *)0x0) {
    free(def->in_state_events);
    free(def->enter_state_events);
    free(def->exit_state_events);
    free(def);
    return;
  }
  __assert_fail("def != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                ,0x9c,
                "void ctemplate_htmlparser::statemachine_definition_delete(statemachine_definition *)"
               );
}

Assistant:

void statemachine_definition_delete(statemachine_definition *def)
{
    assert(def != NULL);
    free(def->in_state_events);
    free(def->enter_state_events);
    free(def->exit_state_events);
    free(def);
}